

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

int llvm::detail::ilogb(double __x)

{
  bool bVar1;
  int iVar2;
  fltSemantics *pfVar3;
  IEEEFloat *in_RDI;
  undefined1 local_30 [4];
  int SignificandBits;
  IEEEFloat Normalized;
  IEEEFloat *Arg_local;
  
  Normalized._16_8_ = in_RDI;
  bVar1 = IEEEFloat::isNaN(in_RDI);
  if (bVar1) {
    Arg_local._4_4_ = -0x80000000;
  }
  else {
    bVar1 = IEEEFloat::isZero((IEEEFloat *)Normalized._16_8_);
    if (bVar1) {
      Arg_local._4_4_ = -0x7fffffff;
    }
    else {
      bVar1 = IEEEFloat::isInfinity((IEEEFloat *)Normalized._16_8_);
      if (bVar1) {
        Arg_local._4_4_ = 0x7fffffff;
      }
      else {
        bVar1 = IEEEFloat::isDenormal((IEEEFloat *)Normalized._16_8_);
        if (bVar1) {
          IEEEFloat::IEEEFloat((IEEEFloat *)local_30,(IEEEFloat *)Normalized._16_8_);
          pfVar3 = IEEEFloat::getSemantics((IEEEFloat *)Normalized._16_8_);
          iVar2 = pfVar3->precision - 1;
          Normalized.significand.part._0_2_ = Normalized.significand.part._0_2_ + (short)iVar2;
          IEEEFloat::normalize((IEEEFloat *)local_30,rmNearestTiesToEven,lfExactlyZero);
          Arg_local._4_4_ = (short)Normalized.significand.part._0_2_ - iVar2;
          IEEEFloat::~IEEEFloat((IEEEFloat *)local_30);
        }
        else {
          Arg_local._4_4_ = (int)*(short *)(Normalized._16_8_ + 0x10);
        }
      }
    }
  }
  return Arg_local._4_4_;
}

Assistant:

int ilogb(const IEEEFloat &Arg) {
  if (Arg.isNaN())
    return IEEEFloat::IEK_NaN;
  if (Arg.isZero())
    return IEEEFloat::IEK_Zero;
  if (Arg.isInfinity())
    return IEEEFloat::IEK_Inf;
  if (!Arg.isDenormal())
    return Arg.exponent;

  IEEEFloat Normalized(Arg);
  int SignificandBits = Arg.getSemantics().precision - 1;

  Normalized.exponent += SignificandBits;
  Normalized.normalize(IEEEFloat::rmNearestTiesToEven, lfExactlyZero);
  return Normalized.exponent - SignificandBits;
}